

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O2

bool __thiscall
glcts::anon_unknown_0::BasicAtomicCase3::RunIteration
          (BasicAtomicCase3 *this,uvec3 *param_1,bool dispatch_indirect)

{
  CallLogWrapper *this_00;
  long length;
  uint uVar1;
  bool bVar2;
  GLuint GVar3;
  GLint location;
  ostream *poVar4;
  void *pvVar5;
  bool *compile_error;
  ulong uVar6;
  GLuint i;
  ulong uVar7;
  uint uVar8;
  GLuint num_groups [3];
  GLuint values [8];
  
  if (this->m_program != 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)values);
  poVar4 = std::operator<<((ostream *)(values + 4),"\nlayout(local_size_x = ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,", local_size_y = ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,", local_size_z = ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,
                           ") in;\nlayout(std430, binding = 0) buffer Output {\n  uint g_uint_out[")
  ;
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,"];\n  int g_int_out[");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,"];\n};\nshared uint g_shared_uint[");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,"];\nshared int g_shared_int[");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4,
                  "];\nuniform uint g_uint_value[8];\nvoid main() {\n  atomicExchange(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[0]);\n  atomicMin(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[1]);\n  atomicMax(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[2]);\n  atomicAnd(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[3]);\n  atomicOr(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[4]);\n  atomicXor(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[5]);\n  atomicCompSwap(g_shared_uint[gl_LocalInvocationIndex], g_uint_value[6], g_uint_value[7]);\n\n  atomicExchange(g_shared_int[gl_LocalInvocationIndex], 3);\n  atomicMin(g_shared_int[gl_LocalInvocationIndex], 1);\n  atomicMax(g_shared_int[gl_LocalInvocationIndex], 2);\n  atomicAnd(g_shared_int[gl_LocalInvocationIndex], 0x1);\n  if (g_uint_value[1] > 0u) {\n    atomicOr(g_shared_int[gl_LocalInvocationIndex], 0x3);\n    atomicXor(g_shared_int[gl_LocalInvocationIndex], 0x1);\n    atomicCompSwap(g_shared_int[gl_LocalInvocationIndex], 0x2, 0x7);\n  }\n\n  g_uint_out[gl_LocalInvocationIndex] = g_shared_uint[gl_LocalInvocationIndex];\n  g_int_out[gl_LocalInvocationIndex] = g_shared_int[gl_LocalInvocationIndex];\n}"
                 );
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)values);
  GVar3 = ComputeShaderBase::CreateComputeProgram
                    (&this->super_ComputeShaderBase,(string *)num_groups);
  this->m_program = GVar3;
  std::__cxx11::string::~string((string *)num_groups);
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
  bVar2 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  if (bVar2) {
    uVar8 = param_1->m_data[1] * param_1->m_data[0] * param_1->m_data[2];
    GVar3 = this->m_storage_buffer;
    if (GVar3 == 0) {
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_storage_buffer);
      GVar3 = this->m_storage_buffer;
    }
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,GVar3);
    uVar6 = (ulong)uVar8;
    length = uVar6 * 4;
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,uVar6 * 8,(void *)0x0,0x88e8);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    values[4] = 3;
    values[5] = 1;
    values[6] = 2;
    values[7] = 7;
    values[0] = 3;
    values[1] = 1;
    values[2] = 2;
    values[3] = 1;
    location = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_uint_value");
    glu::CallLogWrapper::glUniform1uiv(this_00,location,8,values);
    if (dispatch_indirect) {
      num_groups._0_8_ = &DAT_100000001;
      num_groups[2] = 1;
      GVar3 = this->m_dispatch_buffer;
      if (GVar3 == 0) {
        glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_dispatch_buffer);
        GVar3 = this->m_dispatch_buffer;
      }
      glu::CallLogWrapper::glBindBuffer(this_00,0x90ee,GVar3);
      glu::CallLogWrapper::glBufferData(this_00,0x90ee,0xc,num_groups,0x88e4);
      glu::CallLogWrapper::glDispatchComputeIndirect(this_00,0);
    }
    else {
      glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
    }
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    pvVar5 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,length,1);
    bVar2 = true;
    for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      uVar1 = *(uint *)((long)pvVar5 + uVar7 * 4);
      if (uVar1 != 7) {
        bVar2 = false;
        anon_unknown_0::Output
                  ("uData at index %d is %d should be %d.\n",uVar7 & 0xffffffff,(ulong)uVar1,7);
      }
    }
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
    pvVar5 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,length,length,1);
    uVar7 = 0;
    uVar6 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar6 = uVar7;
    }
    for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      uVar8 = *(uint *)((long)pvVar5 + uVar7 * 4);
      if (uVar8 != 7) {
        bVar2 = false;
        anon_unknown_0::Output
                  ("iData at index %d is %d should be %d.\n",uVar7 & 0xffffffff,(ulong)uVar8,7);
      }
    }
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool RunIteration(const uvec3& local_size, bool dispatch_indirect)
	{
		if (m_program != 0)
			glDeleteProgram(m_program);
		m_program = CreateComputeProgram(GenSource(local_size));
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return false;

		const GLuint kBufferSize = local_size.x() * local_size.y() * local_size.z();

		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(GLuint) * kBufferSize * 2, NULL, GL_DYNAMIC_DRAW);

		glUseProgram(m_program);
		GLuint values[8] = { 3u, 1u, 2u, 0x1u, 0x3u, 0x1u, 0x2u, 0x7u };
		glUniform1uiv(glGetUniformLocation(m_program, "g_uint_value"), 8, values);
		if (dispatch_indirect)
		{
			const GLuint num_groups[3] = { 1, 1, 1 };
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_groups), &num_groups[0], GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(1, 1, 1);
		}
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		bool	ret = true;
		GLuint* udata;
		udata = static_cast<GLuint*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(GLuint) * kBufferSize, GL_MAP_READ_BIT));
		for (GLuint i = 0; i < kBufferSize; ++i)
		{
			if (udata[i] != 7)
			{
				Output("uData at index %d is %d should be %d.\n", i, udata[i], 7);
				ret = false;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);

		GLint* idata;
		idata = static_cast<GLint*>(glMapBufferRange(GL_SHADER_STORAGE_BUFFER, sizeof(GLuint) * kBufferSize,
													 sizeof(GLint) * kBufferSize, GL_MAP_READ_BIT));
		for (GLint i = 0; i < static_cast<GLint>(kBufferSize); ++i)
		{
			if (idata[i] != 7)
			{
				Output("iData at index %d is %d should be %d.\n", i, idata[i], 7);
				ret = false;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		return ret;
	}